

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O0

bool __thiscall QTreeViewPrivate::isItemHiddenOrDisabled(QTreeViewPrivate *this,int i)

{
  long lVar1;
  qsizetype qVar2;
  int in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex index;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar3;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_ESI) {
    qVar2 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x3c));
    if (in_ESI < qVar2) {
      QList<QTreeViewItem>::at
                ((QList<QTreeViewItem> *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                 (qsizetype)in_stack_ffffffffffffffa8);
      bVar4 = isRowHidden((QTreeViewPrivate *)
                          CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),in_RDI);
      bVar3 = 1;
      if (!bVar4) {
        bVar4 = QAbstractItemViewPrivate::isIndexEnabled
                          ((QAbstractItemViewPrivate *)
                           CONCAT17(1,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0))
                           ,in_stack_ffffffffffffffa8);
        bVar3 = bVar4 ^ 0xff;
      }
      bVar4 = (bool)(bVar3 & 1);
      goto LAB_009049e1;
    }
  }
  bVar4 = false;
LAB_009049e1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline bool isItemHiddenOrDisabled(int i) const {
        if (i < 0 || i >= viewItems.size())
            return false;
        const QModelIndex index = viewItems.at(i).index;
        return isRowHidden(index) || !isIndexEnabled(index);
    }